

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O1

void duckdb::ArrowTypeExtension::PopulateArrowSchema
               (DuckDBArrowSchemaHolder *root_holder,ArrowSchema *child,LogicalType *duckdb_type,
               ClientContext *context,ArrowTypeExtension *extension)

{
  __buckets_ptr pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  __uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> _Var4;
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> uVar5;
  char *__s;
  reference pvVar6;
  size_type sVar7;
  pointer *__ptr;
  ulong __n;
  size_type sVar8;
  unique_ptr<char[],_std::default_delete<char>,_false> format;
  ArrowSchemaMetadata schema_metadata;
  _Head_base<0UL,_char_*,_false> local_f8;
  undefined1 local_f0 [56];
  __uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> local_b8;
  string local_b0;
  ArrowSchemaMetadata local_90;
  string local_50;
  
  if (extension->populate_arrow_schema == (populate_arrow_schema_t)0x0) {
    pp_Var1 = (__buckets_ptr)(local_f0 + 0x10);
    pcVar3 = (extension->extension_metadata).arrow_format._M_dataplus._M_p;
    local_f0._0_8_ = pp_Var1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_f0,pcVar3,
               pcVar3 + (extension->extension_metadata).arrow_format._M_string_length);
    __n = local_f0._8_8_ + 1;
    __s = (char *)operator_new__(__n);
    switchD_01306cb1::default(__s,0,__n);
    local_f8._M_head_impl = __s;
    if ((__buckets_ptr)local_f0._0_8_ != pp_Var1) {
      operator_delete((void *)local_f0._0_8_);
    }
    pcVar3 = (extension->extension_metadata).arrow_format._M_dataplus._M_p;
    local_f0._0_8_ = pp_Var1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_f0,pcVar3,
               pcVar3 + (extension->extension_metadata).arrow_format._M_string_length);
    if (local_f0._8_8_ == 0) {
      sVar8 = 0;
    }
    else {
      sVar7 = 0;
      do {
        local_f8._M_head_impl[sVar7] = *(char *)(local_f0._0_8_ + sVar7);
        sVar7 = sVar7 + 1;
        sVar8 = local_f0._8_8_;
      } while (local_f0._8_8_ != sVar7);
    }
    if ((__buckets_ptr)local_f0._0_8_ != pp_Var1) {
      operator_delete((void *)local_f0._0_8_);
    }
    local_f8._M_head_impl[sVar8] = '\0';
    ::std::
    vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
    ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
              ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                *)&root_holder->extension_format,
               (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_f8);
    pvVar6 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                       (&root_holder->extension_format);
    child->format =
         (pvVar6->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
         super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    ArrowSchemaMetadata::ArrowSchemaMetadata((ArrowSchemaMetadata *)local_f0);
    paVar2 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    if ((extension->extension_metadata).vendor_name._M_string_length == 0) {
      pcVar3 = (extension->extension_metadata).extension_name._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,
                 pcVar3 + (extension->extension_metadata).extension_name._M_string_length);
      ArrowSchemaMetadata::ArrowCanonicalType(&local_90,&local_b0);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_f0,&local_90);
      uVar5.super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>._M_t.
      super___uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
      super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
           (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
           local_90.extension_metadata_map;
      _Var4._M_t.
      super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
      super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
           local_b8._M_t.
           super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
           super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl;
      local_90.extension_metadata_map.
      super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>._M_t.
      super___uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
      super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
           (__uniq_ptr_data<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true,_true>
            )0x0;
      local_b8._M_t.
      super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
      super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
           (tuple<duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)
           (tuple<duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)
           uVar5.super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
           super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl;
      if (_Var4._M_t.
          super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
          super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)0x0) {
        ::std::default_delete<duckdb::ComplexJSON>::operator()
                  ((default_delete<duckdb::ComplexJSON> *)&local_b8,
                   (ComplexJSON *)
                   _Var4._M_t.
                   super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>
                   .super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl);
      }
      ::std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
                (&local_90.extension_metadata_map.
                  super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&local_90);
    }
    else {
      pcVar3 = (extension->extension_metadata).type_name._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,
                 pcVar3 + (extension->extension_metadata).type_name._M_string_length);
      pcVar3 = (extension->extension_metadata).vendor_name._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,
                 pcVar3 + (extension->extension_metadata).vendor_name._M_string_length);
      ArrowSchemaMetadata::NonCanonicalType(&local_90,&local_b0,&local_50);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_f0,&local_90);
      uVar5.super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>._M_t.
      super___uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
      super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
           (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
           local_90.extension_metadata_map;
      _Var4._M_t.
      super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
      super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
           local_b8._M_t.
           super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
           super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl;
      local_90.extension_metadata_map.
      super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>._M_t.
      super___uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
      super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
           (__uniq_ptr_data<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true,_true>
            )0x0;
      local_b8._M_t.
      super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
      super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
           (tuple<duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)
           (tuple<duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)
           uVar5.super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
           super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl;
      if ((__uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
          _Var4._M_t.
          super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
          super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)0x0) {
        ::std::default_delete<duckdb::ComplexJSON>::operator()
                  ((default_delete<duckdb::ComplexJSON> *)&local_b8,
                   (ComplexJSON *)
                   _Var4._M_t.
                   super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>
                   .super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl);
      }
      ::std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
                (&local_90.extension_metadata_map.
                  super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    ArrowSchemaMetadata::SerializeMetadata(&local_90);
    ::std::
    vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
    ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
              ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                *)&root_holder->metadata_info,
               (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_90);
    if (local_90.schema_metadata_map._M_h._M_buckets != (__buckets_ptr)0x0) {
      operator_delete__(local_90.schema_metadata_map._M_h._M_buckets);
    }
    pvVar6 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                       (&root_holder->metadata_info);
    child->metadata =
         (pvVar6->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
         super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    ::std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
              ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> *)
               &local_b8);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_f0);
    if (local_f8._M_head_impl != (char *)0x0) {
      operator_delete__(local_f8._M_head_impl);
    }
    return;
  }
  (*extension->populate_arrow_schema)(root_holder,child,duckdb_type,context,extension);
  return;
}

Assistant:

void ArrowTypeExtension::PopulateArrowSchema(DuckDBArrowSchemaHolder &root_holder, ArrowSchema &child,
                                             const LogicalType &duckdb_type, ClientContext &context,
                                             const ArrowTypeExtension &extension) {
	if (extension.populate_arrow_schema) {
		extension.populate_arrow_schema(root_holder, child, duckdb_type, context, extension);
		return;
	}

	auto format = make_unsafe_uniq_array<char>(extension.extension_metadata.GetArrowFormat().size() + 1);
	idx_t i = 0;
	for (const auto &c : extension.extension_metadata.GetArrowFormat()) {
		format[i++] = c;
	}
	format[i++] = '\0';
	// We do the default way of populating the schema
	root_holder.extension_format.emplace_back(std::move(format));

	child.format = root_holder.extension_format.back().get();
	ArrowSchemaMetadata schema_metadata;
	if (extension.extension_metadata.IsCanonical()) {
		schema_metadata = ArrowSchemaMetadata::ArrowCanonicalType(extension.extension_metadata.GetExtensionName());
	} else {
		schema_metadata = ArrowSchemaMetadata::NonCanonicalType(extension.extension_metadata.GetTypeName(),
		                                                        extension.extension_metadata.GetVendorName());
	}
	root_holder.metadata_info.emplace_back(schema_metadata.SerializeMetadata());
	child.metadata = root_holder.metadata_info.back().get();
}